

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  size_t sVar1;
  char *pcVar2;
  Array<char> *other;
  char *in_RCX;
  long *plVar3;
  long *local_88;
  AsyncInputStream *local_80;
  char *pcStack_78;
  Array<char> local_70;
  undefined1 local_48 [8];
  Promise<unsigned_long> promise;
  Array<char> buffer;
  AsyncInputStream *in_local;
  StringPtr expected_local;
  
  in_local = (AsyncInputStream *)expected.content.size_;
  plVar3 = (long *)expected.content.ptr;
  expected_local.content.ptr = in_RCX;
  expected_local.content.size_ = (size_t)in;
  sVar1 = StringPtr::size((StringPtr *)&in_local);
  if (sVar1 == 0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)in);
  }
  else {
    sVar1 = StringPtr::size((StringPtr *)&in_local);
    heapArray<char>((Array<char> *)&promise,sVar1);
    pcVar2 = Array<char>::begin((Array<char> *)&promise);
    sVar1 = Array<char>::size((Array<char> *)&promise);
    (**(code **)(*plVar3 + 8))(local_48,plVar3,pcVar2,1,sVar1);
    local_80 = in_local;
    pcStack_78 = expected_local.content.ptr;
    local_88 = plVar3;
    other = mv<kj::Array<char>>((Array<char> *)&promise);
    Array<char>::Array(&local_70,other);
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::__0>
              ((Promise<unsigned_long> *)in,(Type *)local_48);
    (anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::$_0::~__0
              ((__0 *)&local_88);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_48);
    Array<char>::~Array((Array<char> *)&promise);
  }
  return (PromiseBase)(PromiseBase)in;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then([&in,expected,buffer=kj::mv(buffer)](size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.first(amount);
    if (actual != expected.asBytes().first(amount)) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  });
}